

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void iDynTree::assertWoAbort(char *semCheck,char *file,char *func,int line)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,file);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,func);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1,": Failed assertion \'");
  poVar1 = std::operator<<(poVar1,semCheck);
  std::operator<<(poVar1,"\'.\n");
  return;
}

Assistant:

void assertWoAbort(const char* semCheck, const char* file, const char* func, int line)
    {
        std::cerr << file << ": " << func << ": " << line << ": Failed assertion '" << semCheck << "'.\n";
    }